

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode singleipconnect(connectdata *conn,Curl_addrinfo *ai,curl_socket_t *sockp)

{
  SessionHandle *data_00;
  bool bVar1;
  curl_socket_t sockfd_00;
  _Bool _Var2;
  int iVar3;
  uint uVar4;
  CURLcode CVar5;
  uint *puVar6;
  char *pcVar7;
  int *piVar8;
  bool bVar9;
  timeval tVar10;
  __time_t local_128;
  __suseconds_t local_120;
  _Bool is_tcp;
  long port;
  char ipaddress [46];
  CURLcode result;
  curl_socket_t sockfd;
  SessionHandle *data;
  _Bool isconnected;
  int error;
  int rc;
  Curl_sockaddr_ex addr;
  curl_socket_t *sockp_local;
  Curl_addrinfo *ai_local;
  connectdata *conn_local;
  
  bVar1 = false;
  data_00 = conn->data;
  *sockp = -1;
  addr._sa_ex_u._120_8_ = sockp;
  ipaddress._40_4_ =
       Curl_socket(conn,ai,(Curl_sockaddr_ex *)&error,(curl_socket_t *)(ipaddress + 0x2c));
  if (ipaddress._40_4_ == CURLE_OK) {
    _Var2 = getaddressinfo((sockaddr *)&addr.protocol,(char *)&port,(long *)&stack0xfffffffffffffef0
                          );
    if (_Var2) {
      Curl_infof(data_00,"  Trying %s...\n",&port);
      bVar9 = error == 2;
      if ((bVar9 && rc == 1) && (((data_00->set).tcp_nodelay & 1U) != 0)) {
        tcpnodelay(conn,stack0xffffffffffffff2c);
      }
      if ((bVar9 && rc == 1) && (((data_00->set).tcp_keepalive & 1U) != 0)) {
        tcpkeepalive(data_00,stack0xffffffffffffff2c);
      }
      if ((data_00->set).fsockopt != (curl_sockopt_callback)0x0) {
        iVar3 = (*(data_00->set).fsockopt)
                          ((data_00->set).sockopt_client,stack0xffffffffffffff2c,CURLSOCKTYPE_IPCXN)
        ;
        if (iVar3 == 2) {
          bVar1 = true;
        }
        else if (iVar3 != 0) {
          Curl_closesocket(conn,stack0xffffffffffffff2c);
          return CURLE_ABORTED_BY_CALLBACK;
        }
      }
      sockfd_00 = stack0xffffffffffffff2c;
      if (error == 2) {
        uVar4 = Curl_ipv6_scope((sockaddr *)&addr.protocol);
        ipaddress._40_4_ = bindlocal(conn,sockfd_00,2,uVar4);
        if (ipaddress._40_4_ != CURLE_OK) {
          Curl_closesocket(conn,stack0xffffffffffffff2c);
          if (ipaddress._40_4_ == 1) {
            return CURLE_COULDNT_CONNECT;
          }
          CVar5._0_1_ = ipaddress[0x28];
          CVar5._1_1_ = ipaddress[0x29];
          CVar5._2_1_ = ipaddress[0x2a];
          CVar5._3_1_ = ipaddress[0x2b];
          return CVar5;
        }
      }
      curlx_nonblock(stack0xffffffffffffff2c,1);
      tVar10 = curlx_tvnow();
      local_128 = tVar10.tv_sec;
      (conn->connecttime).tv_sec = local_128;
      local_120 = tVar10.tv_usec;
      (conn->connecttime).tv_usec = local_120;
      if (1 < conn->num_addr) {
        Curl_expire_latest(data_00,conn->timeoutms_per_addr);
      }
      if ((bVar1) || (conn->socktype != 1)) {
        *(curl_socket_t *)addr._sa_ex_u._120_8_ = stack0xffffffffffffff2c;
        conn_local._4_4_ = CURLE_OK;
      }
      else {
        iVar3 = connect(stack0xffffffffffffff2c,(sockaddr *)&addr.protocol,addr.socktype);
        if (iVar3 == -1) {
          piVar8 = __errno_location();
          iVar3 = *piVar8;
          if ((iVar3 == 0xb) || (iVar3 == 0x73)) {
            ipaddress[0x28] = '\0';
            ipaddress[0x29] = '\0';
            ipaddress[0x2a] = '\0';
            ipaddress[0x2b] = '\0';
          }
          else {
            pcVar7 = Curl_strerror(conn,iVar3);
            Curl_infof(data_00,"Immediate connect fail for %s: %s\n",&port,pcVar7);
            (data_00->state).os_errno = iVar3;
            Curl_closesocket(conn,stack0xffffffffffffff2c);
            ipaddress[0x28] = '\a';
            ipaddress[0x29] = '\0';
            ipaddress[0x2a] = '\0';
            ipaddress[0x2b] = '\0';
          }
        }
        if (ipaddress._40_4_ == 0) {
          *(curl_socket_t *)addr._sa_ex_u._120_8_ = stack0xffffffffffffff2c;
        }
        conn_local._4_1_ = ipaddress[0x28];
        conn_local._5_1_ = ipaddress[0x29];
        conn_local._6_1_ = ipaddress[0x2a];
        conn_local._7_1_ = ipaddress[0x2b];
      }
    }
    else {
      puVar6 = (uint *)__errno_location();
      uVar4 = *puVar6;
      pcVar7 = Curl_strerror(conn,uVar4);
      Curl_failf(data_00,"sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar4,pcVar7);
      Curl_closesocket(conn,stack0xffffffffffffff2c);
      conn_local._4_4_ = CURLE_OK;
    }
  }
  else {
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode singleipconnect(struct connectdata *conn,
                                const Curl_addrinfo *ai,
                                curl_socket_t *sockp)
{
  struct Curl_sockaddr_ex addr;
  int rc;
  int error = 0;
  bool isconnected = FALSE;
  struct SessionHandle *data = conn->data;
  curl_socket_t sockfd;
  CURLcode result;
  char ipaddress[MAX_IPADR_LEN];
  long port;
  bool is_tcp;

  *sockp = CURL_SOCKET_BAD;

  result = Curl_socket(conn, ai, &addr, &sockfd);
  if(result)
    /* Failed to create the socket, but still return OK since we signal the
       lack of socket as well. This allows the parent function to keep looping
       over alternative addresses/socket families etc. */
    return CURLE_OK;

  /* store remote address and port used in this connection attempt */
  if(!getaddressinfo((struct sockaddr*)&addr.sa_addr,
                     ipaddress, &port)) {
    /* malformed address or bug in inet_ntop, try next address */
    error = ERRNO;
    failf(data, "sa_addr inet_ntop() failed with errno %d: %s",
          error, Curl_strerror(conn, error));
    Curl_closesocket(conn, sockfd);
    return CURLE_OK;
  }
  infof(data, "  Trying %s...\n", ipaddress);

#ifdef ENABLE_IPV6
  is_tcp = (addr.family == AF_INET || addr.family == AF_INET6) &&
    addr.socktype == SOCK_STREAM;
#else
  is_tcp = (addr.family == AF_INET) && addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    tcpnodelay(conn, sockfd);

  nosigpipe(conn, sockfd);

  Curl_sndbufset(sockfd);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, sockfd);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    error = data->set.fsockopt(data->set.sockopt_client,
                               sockfd,
                               CURLSOCKTYPE_IPCXN);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      Curl_closesocket(conn, sockfd); /* close the socket and bail out */
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  /* possibly bind the local end to an IP, interface or port */
  if(addr.family == AF_INET
#ifdef ENABLE_IPV6
     || addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(conn, sockfd, addr.family,
                       Curl_ipv6_scope((struct sockaddr*)&addr.sa_addr));
    if(result) {
      Curl_closesocket(conn, sockfd); /* close socket and bail out */
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        return CURLE_COULDNT_CONNECT;
      }
      return result;
    }
  }

  /* set socket non-blocking */
  (void)curlx_nonblock(sockfd, TRUE);

  conn->connecttime = Curl_tvnow();
  if(conn->num_addr > 1)
    Curl_expire_latest(data, conn->timeoutms_per_addr);

  /* Connect TCP sockets, bind UDP */
  if(!isconnected && (conn->socktype == SOCK_STREAM)) {
    rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
    if(-1 == rc)
      error = SOCKERRNO;
  }
  else {
    *sockp = sockfd;
    return CURLE_OK;
  }

#ifdef ENABLE_IPV6
  conn->bits.ipv6 = (addr.family == AF_INET6)?TRUE:FALSE;
#endif

  if(-1 == rc) {
    switch(error) {
    case EINPROGRESS:
    case EWOULDBLOCK:
#if defined(EAGAIN)
#if (EAGAIN) != (EWOULDBLOCK)
      /* On some platforms EAGAIN and EWOULDBLOCK are the
       * same value, and on others they are different, hence
       * the odd #if
       */
    case EAGAIN:
#endif
#endif
      result = CURLE_OK;
      break;

    default:
      /* unknown error, fallthrough and try another address! */
      infof(data, "Immediate connect fail for %s: %s\n",
            ipaddress, Curl_strerror(conn, error));
      data->state.os_errno = error;

      /* connect failed */
      Curl_closesocket(conn, sockfd);
      result = CURLE_COULDNT_CONNECT;
    }
  }

  if(!result)
    *sockp = sockfd;

  return result;
}